

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

int __thiscall
QCache<QtFontFallbacksCacheKey,_QList<QString>_>::unlink
          (QCache<QtFontFallbacksCacheKey,_QList<QString>_> *this,char *__name)

{
  long lVar1;
  int extraout_EAX;
  size_t hash;
  Bucket bucket;
  
  lVar1 = *(long *)__name;
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)(__name + 8);
  **(long **)(__name + 8) = lVar1;
  this->total = this->total - *(long *)(__name + 0x40);
  hash = QHashPrivate::calculateHash<QtFontFallbacksCacheKey>
                   ((QtFontFallbacksCacheKey *)(__name + 0x10),(this->d).seed);
  bucket = QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::
           findBucketWithHash<QtFontFallbacksCacheKey>
                     (&this->d,(QtFontFallbacksCacheKey *)(__name + 0x10),hash);
  QHashPrivate::Data<QCache<QtFontFallbacksCacheKey,_QList<QString>_>::Node>::erase(&this->d,bucket)
  ;
  return extraout_EAX;
}

Assistant:

void unlink(Node *n) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        Q_ASSERT(n->prev);
        Q_ASSERT(n->next);
        n->prev->next = n->next;
        n->next->prev = n->prev;
        total -= n->value.cost;
        auto it = d.findBucket(n->key);
        d.erase(it);
    }